

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio_category.h
# Opt level: O2

void __thiscall booster::aio::aio_error::category::~category(category *this)

{
  std::_V2::error_category::~error_category(&this->super_error_category);
  operator_delete(this);
  return;
}

Assistant:

class BOOSTER_API category : public system::error_category {
		public:
			category() {}
			category(category &&) {}
			/// Get category name
			virtual char const *name() const noexcept;
			/// Get message from code
			virtual std::string message(int cat) const;
		}